

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject_p.h
# Opt level: O0

Connection
QObjectPrivate::
connect<void(QAbstractItemModel::*)(QModelIndex_const&,QModelIndex_const&,QList<int>const&),void(QIdentityProxyModelPrivate::*)(QModelIndex_const&,QModelIndex_const&,QList<int>const&)>
          (Object *sender,offset_in_QAbstractItemModel_to_subr signal,Object *receiverPrivate,
          Function slot,ConnectionType type)

{
  QSlotObjectBase *in_RCX;
  void *in_RDI;
  int in_R9D;
  long in_FS_OFFSET;
  QObject *unaff_retaddr;
  void **in_stack_00000008;
  QObject *in_stack_00000010;
  int *types;
  int *in_stack_000000c8;
  QMetaObject *in_stack_000000d0;
  Function in_stack_ffffffffffffff30;
  QPrivateSlotObject<void_(QIdentityProxyModelPrivate::*)(const_QModelIndex_&,_const_QModelIndex_&,_const_QList<int>_&),_QtPrivate::List<const_QModelIndex_&,_const_QModelIndex_&,_const_QList<int>_&>,_void>
  *in_stack_ffffffffffffff40;
  void **slot_00;
  
  slot_00 = *(void ***)(in_FS_OFFSET + 0x28);
  if ((in_R9D == 2) || (in_R9D == 3)) {
    QtPrivate::
    ConnectionTypes<QtPrivate::List<const_QModelIndex_&,_const_QModelIndex_&,_const_QList<int>_&>,_true>
    ::types();
  }
  QtPrivate::getQObject((QObjectPrivate *)0x869ca9);
  operator_new(0x20);
  QtPrivate::
  QPrivateSlotObject<void_(QIdentityProxyModelPrivate::*)(const_QModelIndex_&,_const_QModelIndex_&,_const_QList<int>_&),_QtPrivate::List<const_QModelIndex_&,_const_QModelIndex_&,_const_QList<int>_&>,_void>
  ::QPrivateSlotObject(in_stack_ffffffffffffff40,in_stack_ffffffffffffff30);
  QObject::connectImpl
            (in_stack_00000010,in_stack_00000008,unaff_retaddr,slot_00,in_RCX,(ConnectionType)signal
             ,in_stack_000000c8,in_stack_000000d0);
  if (*(void ***)(in_FS_OFFSET + 0x28) == slot_00) {
    return (Connection)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

inline QMetaObject::Connection QObjectPrivate::connect(const typename QtPrivate::FunctionPointer<Func1>::Object *sender, Func1 signal,
                                                       const typename QtPrivate::FunctionPointer<Func2>::Object *receiverPrivate, Func2 slot,
                                                       Qt::ConnectionType type)
{
    typedef QtPrivate::FunctionPointer<Func1> SignalType;
    typedef QtPrivate::FunctionPointer<Func2> SlotType;
    static_assert(QtPrivate::HasQ_OBJECT_Macro<typename SignalType::Object>::Value,
                      "No Q_OBJECT in the class with the signal");

    //compilation error if the arguments does not match.
    static_assert(int(SignalType::ArgumentCount) >= int(SlotType::ArgumentCount),
                      "The slot requires more arguments than the signal provides.");
    static_assert((QtPrivate::CheckCompatibleArguments<typename SignalType::Arguments, typename SlotType::Arguments>::value),
                      "Signal and slot arguments are not compatible.");
    static_assert((QtPrivate::AreArgumentsCompatible<typename SlotType::ReturnType, typename SignalType::ReturnType>::value),
                      "Return type of the slot is not compatible with the return type of the signal.");

    const int *types = nullptr;
    if (type == Qt::QueuedConnection || type == Qt::BlockingQueuedConnection)
        types = QtPrivate::ConnectionTypes<typename SignalType::Arguments>::types();

    return QObject::connectImpl(sender, reinterpret_cast<void **>(&signal),
        QtPrivate::getQObject(receiverPrivate), reinterpret_cast<void **>(&slot),
        new QtPrivate::QPrivateSlotObject<Func2, typename QtPrivate::List_Left<typename SignalType::Arguments, SlotType::ArgumentCount>::Value,
                                        typename SignalType::ReturnType>(slot),
        type, types, &SignalType::Object::staticMetaObject);
}